

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aescrypt2.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  mbedtls_md_info_t *md_info;
  FILE *__stream;
  FILE *__stream_00;
  long lVar4;
  size_t sVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  uchar *puVar9;
  char *pcVar10;
  ulong uVar11;
  int *piVar12;
  bool bVar13;
  size_t sStack_7f0;
  uint n;
  FILE *local_7e0;
  long local_7d8;
  ulong local_7d0;
  ulong local_7c8;
  FILE *local_7c0;
  byte local_7b8 [8];
  undefined7 uStack_7b0;
  byte bStack_7a9;
  mbedtls_md_context_t sha_ctx;
  byte local_788 [8];
  uchar auStack_780 [32];
  uchar auStack_760 [8];
  mbedtls_aes_context aes_ctx;
  uchar key [512];
  uchar buffer [1024];
  
  mbedtls_aes_init(&aes_ctx);
  mbedtls_md_init(&sha_ctx);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
  iVar2 = mbedtls_md_setup(&sha_ctx,md_info,1);
  if (iVar2 != 0) {
    printf("  ! mbedtls_md_setup() returned -0x%04x\n");
    goto LAB_00103aad;
  }
  if (argc == 5) {
    uVar3 = atoi(argv[1]);
    iVar2 = 0;
    memset(key,0,0x200);
    local_788[0] = '\0';
    local_788[1] = '\0';
    local_788[2] = '\0';
    local_788[3] = '\0';
    local_788[4] = '\0';
    local_788[5] = '\0';
    local_788[6] = '\0';
    local_788[7] = '\0';
    auStack_780[0] = '\0';
    auStack_780[1] = '\0';
    auStack_780[2] = '\0';
    auStack_780[3] = '\0';
    auStack_780[4] = '\0';
    auStack_780[5] = '\0';
    auStack_780[6] = '\0';
    auStack_780[7] = '\0';
    auStack_780[8] = '\0';
    auStack_780[9] = '\0';
    auStack_780[10] = '\0';
    auStack_780[0xb] = '\0';
    auStack_780[0xc] = '\0';
    auStack_780[0xd] = '\0';
    auStack_780[0xe] = '\0';
    auStack_780[0xf] = '\0';
    auStack_780[0x10] = '\0';
    auStack_780[0x11] = '\0';
    auStack_780[0x12] = '\0';
    auStack_780[0x13] = '\0';
    auStack_780[0x14] = '\0';
    auStack_780[0x15] = '\0';
    auStack_780[0x16] = '\0';
    auStack_780[0x17] = '\0';
    puVar9 = buffer;
    memset(puVar9,0,0x400);
    if (1 < uVar3) {
      fwrite("invalide operation mode\n",0x18,1,_stderr);
      goto LAB_00103aad;
    }
    pcVar10 = argv[2];
    iVar2 = strcmp(pcVar10,argv[3]);
    if (iVar2 != 0) {
      __stream = fopen(pcVar10,"rb");
      if (__stream == (FILE *)0x0) {
        iVar2 = 0;
        fprintf(_stderr,"fopen(%s,rb) failed\n",argv[2]);
        goto LAB_00103aad;
      }
      local_7c0 = fopen(argv[3],"wb+");
      if (local_7c0 == (FILE *)0x0) {
        fprintf(_stderr,"fopen(%s,wb+) failed\n",argv[3]);
      }
      else {
        __stream_00 = fopen(argv[4],"rb");
        local_7e0 = __stream;
        if (__stream_00 == (FILE *)0x0) {
          piVar12 = (int *)argv[4];
          if (*piVar12 == 0x3a786568) {
            local_7d8 = CONCAT44(local_7d8._4_4_,uVar3);
            piVar12 = piVar12 + 1;
            local_7d0 = 0;
            while( true ) {
              iVar2 = __isoc99_sscanf(piVar12,"%02X",&n);
              if ((iVar2 < 1) || (0x1ff < local_7d0)) break;
              key[local_7d0] = (uchar)n;
              local_7d0 = local_7d0 + 1;
              piVar12 = (int *)((long)piVar12 + 2);
            }
            __stream = local_7e0;
            uVar3 = (uint)local_7d8;
          }
          else {
            sVar5 = strlen((char *)piVar12);
            local_7d0 = 0x200;
            if (sVar5 < 0x200) {
              local_7d0 = sVar5;
            }
            memcpy(key,piVar12,local_7d0);
          }
        }
        else {
          local_7d0 = fread(key,1,0x200,__stream_00);
          fclose(__stream_00);
        }
        iVar2 = fileno(__stream);
        uVar11 = lseek(iVar2,0,2);
        if ((long)uVar11 < 0) {
          perror("lseek");
        }
        else {
          iVar2 = fseek(__stream,0,0);
          if (iVar2 < 0) {
            pcVar10 = "fseek(0,SEEK_SET) failed\n";
            sStack_7f0 = 0x19;
          }
          else {
            local_7c8 = uVar11;
            if ((uVar3 & 1) == 0) {
              for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 8) {
                *puVar9 = (uchar)(uVar11 >> ((byte)lVar7 & 0x3f));
                puVar9 = puVar9 + 1;
              }
              local_7d8 = CONCAT44(local_7d8._4_4_,uVar3);
              puVar9 = (uchar *)argv[2];
              mbedtls_md_starts(&sha_ctx);
              mbedtls_md_update(&sha_ctx,buffer,8);
              sVar5 = strlen((char *)puVar9);
              mbedtls_md_update(&sha_ctx,puVar9,sVar5);
              mbedtls_md_finish(&sha_ctx,local_788);
              local_7b8[0] = local_788[0];
              local_7b8[1] = local_788[1];
              local_7b8[2] = local_788[2];
              local_7b8[3] = local_788[3];
              local_7b8[4] = local_788[4];
              local_7b8[5] = local_788[5];
              local_7b8[6] = local_788[6];
              local_7b8[7] = local_788[7];
              bStack_7a9 = SUB81(auStack_780._0_8_,7);
              uStack_7b0 = (undefined7)auStack_780._0_8_;
              bStack_7a9 = bStack_7a9 & 0xf0 | (byte)local_7c8 & 0xf;
              sVar5 = fwrite(local_7b8,1,0x10,local_7c0);
              if (sVar5 == 0x10) {
                auStack_780[8] = '\0';
                auStack_780[9] = '\0';
                auStack_780[10] = '\0';
                auStack_780[0xb] = '\0';
                auStack_780[0xc] = '\0';
                auStack_780[0xd] = '\0';
                auStack_780[0xe] = '\0';
                auStack_780[0xf] = '\0';
                auStack_780[0x10] = '\0';
                auStack_780[0x11] = '\0';
                auStack_780[0x12] = '\0';
                auStack_780[0x13] = '\0';
                auStack_780[0x14] = '\0';
                auStack_780[0x15] = '\0';
                auStack_780[0x16] = '\0';
                auStack_780[0x17] = '\0';
                local_788[0] = local_7b8[0];
                local_788[1] = local_7b8[1];
                local_788[2] = local_7b8[2];
                local_788[3] = local_7b8[3];
                local_788[4] = local_7b8[4];
                local_788[5] = local_7b8[5];
                local_788[6] = local_7b8[6];
                local_788[7] = local_7b8[7];
                auStack_780[0] = (uchar)uStack_7b0;
                auStack_780[1] = uStack_7b0._1_1_;
                auStack_780[2] = uStack_7b0._2_1_;
                auStack_780[3] = uStack_7b0._3_1_;
                auStack_780[4] = uStack_7b0._4_1_;
                auStack_780[5] = uStack_7b0._5_1_;
                auStack_780[6] = uStack_7b0._6_1_;
                auStack_780[7] = bStack_7a9;
                iVar2 = 0x2000;
                while (bVar13 = iVar2 != 0, iVar2 = iVar2 + -1, bVar13) {
                  mbedtls_md_starts(&sha_ctx);
                  mbedtls_md_update(&sha_ctx,local_788,0x20);
                  mbedtls_md_update(&sha_ctx,key,local_7d0);
                  mbedtls_md_finish(&sha_ctx,local_788);
                }
                mbedtls_aes_setkey_enc(&aes_ctx,local_788,0x100);
                mbedtls_md_hmac_starts(&sha_ctx,local_788,0x20);
                __stream = local_7e0;
                for (lVar7 = 0; uVar11 = local_7c8 - lVar7, uVar11 != 0 && lVar7 <= (long)local_7c8;
                    lVar7 = lVar7 + 0x10) {
                  if (0xf < (long)uVar11) {
                    uVar11 = 0x10;
                  }
                  n = (uint)uVar11;
                  sVar5 = fread(buffer,1,uVar11 & 0xffffffff,__stream);
                  if (sVar5 != n) {
                    fprintf(_stderr,"fread(%d bytes) failed\n");
                    goto LAB_00103a93;
                  }
                  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
                    buffer[lVar4] = buffer[lVar4] ^ local_7b8[lVar4];
                  }
                  mbedtls_aes_crypt_ecb(&aes_ctx,1,buffer,buffer);
                  mbedtls_md_hmac_update(&sha_ctx,buffer,0x10);
                  sVar5 = fwrite(buffer,1,0x10,local_7c0);
                  if (sVar5 != 0x10) {
                    fprintf(_stderr,"fwrite(%d bytes) failed\n",0x10);
                    goto LAB_00103a93;
                  }
                  local_7b8[0] = buffer[0];
                  local_7b8[1] = buffer[1];
                  local_7b8[2] = buffer[2];
                  local_7b8[3] = buffer[3];
                  local_7b8[4] = buffer[4];
                  local_7b8[5] = buffer[5];
                  local_7b8[6] = buffer[6];
                  local_7b8[7] = buffer[7];
                  uStack_7b0._0_1_ = buffer[8];
                  uStack_7b0._1_1_ = buffer[9];
                  uStack_7b0._2_1_ = buffer[10];
                  uStack_7b0._3_1_ = buffer[0xb];
                  uStack_7b0._4_1_ = buffer[0xc];
                  uStack_7b0._5_1_ = buffer[0xd];
                  uStack_7b0._6_1_ = buffer[0xe];
                  bStack_7a9 = buffer[0xf];
                }
                mbedtls_md_hmac_finish(&sha_ctx,local_788);
                sVar5 = fwrite(local_788,1,0x20,local_7c0);
                if (sVar5 == 0x20) {
                  if ((uint)local_7d8 != 1) goto LAB_00103a93;
                  goto LAB_00103717;
                }
              }
              pcVar10 = "fwrite(%d bytes) failed\n";
LAB_00103a4e:
              sStack_7f0 = 0x10;
LAB_00103a8b:
              fprintf(_stderr,pcVar10,sStack_7f0);
              goto LAB_00103a93;
            }
LAB_00103717:
            uVar11 = local_7c8;
            if ((long)local_7c8 < 0x30) {
              pcVar10 = "File too short to be encrypted.\n";
            }
            else {
              if ((local_7c8 & 0xf) == 0) {
                sVar5 = fread(buffer,1,0x10,__stream);
                if (sVar5 == 0x10) {
                  local_7d8 = uVar11 - 0x30;
                  local_7b8[0] = buffer[0];
                  local_7b8[1] = buffer[1];
                  local_7b8[2] = buffer[2];
                  local_7b8[3] = buffer[3];
                  local_7b8[4] = buffer[4];
                  local_7b8[5] = buffer[5];
                  local_7b8[6] = buffer[6];
                  local_7b8[7] = buffer[7];
                  uStack_7b0._0_1_ = buffer[8];
                  uStack_7b0._1_1_ = buffer[9];
                  uStack_7b0._2_1_ = buffer[10];
                  uStack_7b0._3_1_ = buffer[0xb];
                  uStack_7b0._4_1_ = buffer[0xc];
                  uStack_7b0._5_1_ = buffer[0xd];
                  uStack_7b0._6_1_ = buffer[0xe];
                  bStack_7a9 = buffer[0xf];
                  uVar1 = _uStack_7b0;
                  bStack_7a9 = SUB81(buffer._8_8_,7);
                  uVar3 = (uint)bStack_7a9;
                  auStack_780[8] = '\0';
                  auStack_780[9] = '\0';
                  auStack_780[10] = '\0';
                  auStack_780[0xb] = '\0';
                  auStack_780[0xc] = '\0';
                  auStack_780[0xd] = '\0';
                  auStack_780[0xe] = '\0';
                  auStack_780[0xf] = '\0';
                  auStack_780[0x10] = '\0';
                  auStack_780[0x11] = '\0';
                  auStack_780[0x12] = '\0';
                  auStack_780[0x13] = '\0';
                  auStack_780[0x14] = '\0';
                  auStack_780[0x15] = '\0';
                  auStack_780[0x16] = '\0';
                  auStack_780[0x17] = '\0';
                  local_788[0] = buffer[0];
                  local_788[1] = buffer[1];
                  local_788[2] = buffer[2];
                  local_788[3] = buffer[3];
                  local_788[4] = buffer[4];
                  local_788[5] = buffer[5];
                  local_788[6] = buffer[6];
                  local_788[7] = buffer[7];
                  auStack_780[0] = buffer[8];
                  auStack_780[1] = buffer[9];
                  auStack_780[2] = buffer[10];
                  auStack_780[3] = buffer[0xb];
                  auStack_780[4] = buffer[0xc];
                  auStack_780[5] = buffer[0xd];
                  auStack_780[6] = buffer[0xe];
                  auStack_780[7] = buffer[0xf];
                  iVar2 = 0x2000;
                  _uStack_7b0 = uVar1;
                  while (bVar13 = iVar2 != 0, iVar2 = iVar2 + -1, bVar13) {
                    mbedtls_md_starts(&sha_ctx);
                    mbedtls_md_update(&sha_ctx,local_788,0x20);
                    mbedtls_md_update(&sha_ctx,key,local_7d0);
                    mbedtls_md_finish(&sha_ctx,local_788);
                  }
                  mbedtls_aes_setkey_dec(&aes_ctx,local_788,0x100);
                  mbedtls_md_hmac_starts(&sha_ctx,local_788,0x20);
                  local_7c8 = local_7c8 - 0x40;
                  uVar11 = 0;
LAB_0010380a:
                  if ((long)uVar11 < local_7d8) {
                    sVar5 = fread(buffer,1,0x10,local_7e0);
                    if (sVar5 == 0x10) goto code_r0x00103832;
                    pcVar10 = "fread(%d bytes) failed\n";
                    uVar8 = 0x10;
                    goto LAB_00103a66;
                  }
                  mbedtls_md_hmac_finish(&sha_ctx,local_788);
                  __stream = local_7e0;
                  sVar5 = fread(buffer,1,0x20,local_7e0);
                  if (sVar5 == 0x20) {
                    bVar6 = 0;
                    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
                      bVar6 = bVar6 | buffer[lVar7] ^ local_788[lVar7];
                    }
                    if (bVar6 != 0) {
                      pcVar10 = "HMAC check failed: wrong key, or file corrupted.\n";
                      sStack_7f0 = 0x31;
                      goto LAB_00103a32;
                    }
                    goto LAB_00103a93;
                  }
                  pcVar10 = "fread(%d bytes) failed\n";
                  sStack_7f0 = 0x20;
                  goto LAB_00103a8b;
                }
                pcVar10 = "fread(%d bytes) failed\n";
                goto LAB_00103a4e;
              }
              pcVar10 = "File size not a multiple of 16.\n";
            }
            sStack_7f0 = 0x20;
          }
LAB_00103a32:
          fwrite(pcVar10,sStack_7f0,1,_stderr);
        }
      }
LAB_00103a93:
      fclose(__stream);
      iVar2 = 0;
      if (local_7c0 != (FILE *)0x0) {
        fclose(local_7c0);
      }
      goto LAB_00103aad;
    }
    fwrite("input and output filenames must differ\n",0x27,1,_stderr);
  }
  else {
    puts(
        "\n  aescrypt2 <mode> <input filename> <output filename> <key>\n\n   <mode>: 0 = encrypt, 1 = decrypt\n\n  example: aescrypt2 0 file file.aes hex:E76B2413958B00E193\n"
        );
  }
  iVar2 = 0;
LAB_00103aad:
  for (uVar11 = 0; (uint)argc != uVar11; uVar11 = uVar11 + 1) {
    pcVar10 = argv[uVar11];
    sVar5 = strlen(pcVar10);
    memset(pcVar10,0,sVar5);
  }
  memset(key,0,0x200);
  memset(buffer,0,0x400);
  local_788[0] = 0;
  local_788[1] = 0;
  local_788[2] = 0;
  local_788[3] = 0;
  local_788[4] = 0;
  local_788[5] = 0;
  local_788[6] = 0;
  local_788[7] = 0;
  auStack_780[0] = '\0';
  auStack_780[1] = '\0';
  auStack_780[2] = '\0';
  auStack_780[3] = '\0';
  auStack_780[4] = '\0';
  auStack_780[5] = '\0';
  auStack_780[6] = '\0';
  auStack_780[7] = '\0';
  auStack_780[8] = '\0';
  auStack_780[9] = '\0';
  auStack_780[10] = '\0';
  auStack_780[0xb] = '\0';
  auStack_780[0xc] = '\0';
  auStack_780[0xd] = '\0';
  auStack_780[0xe] = '\0';
  auStack_780[0xf] = '\0';
  auStack_780[0x10] = '\0';
  auStack_780[0x11] = '\0';
  auStack_780[0x12] = '\0';
  auStack_780[0x13] = '\0';
  auStack_780[0x14] = '\0';
  auStack_780[0x15] = '\0';
  auStack_780[0x16] = '\0';
  auStack_780[0x17] = '\0';
  mbedtls_aes_free(&aes_ctx);
  mbedtls_md_free(&sha_ctx);
  return iVar2;
code_r0x00103832:
  auStack_780[0x18] = buffer[0];
  auStack_780[0x19] = buffer[1];
  auStack_780[0x1a] = buffer[2];
  auStack_780[0x1b] = buffer[3];
  auStack_780[0x1c] = buffer[4];
  auStack_780[0x1d] = buffer[5];
  auStack_780[0x1e] = buffer[6];
  auStack_780[0x1f] = buffer[7];
  auStack_760[0] = buffer[8];
  auStack_760[1] = buffer[9];
  auStack_760[2] = buffer[10];
  auStack_760[3] = buffer[0xb];
  auStack_760[4] = buffer[0xc];
  auStack_760[5] = buffer[0xd];
  auStack_760[6] = buffer[0xe];
  auStack_760[7] = buffer[0xf];
  mbedtls_md_hmac_update(&sha_ctx,buffer,0x10);
  mbedtls_aes_crypt_ecb(&aes_ctx,0,buffer,buffer);
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    buffer[lVar7] = buffer[lVar7] ^ local_7b8[lVar7];
  }
  sVar5 = 0x10;
  if (uVar11 == local_7c8) {
    sVar5 = (size_t)(uVar3 & 0xf);
  }
  local_7b8[0] = auStack_780[0x18];
  local_7b8[1] = auStack_780[0x19];
  local_7b8[2] = auStack_780[0x1a];
  local_7b8[3] = auStack_780[0x1b];
  local_7b8[4] = auStack_780[0x1c];
  local_7b8[5] = auStack_780[0x1d];
  local_7b8[6] = auStack_780[0x1e];
  local_7b8[7] = auStack_780[0x1f];
  uStack_7b0._0_1_ = auStack_760[0];
  uStack_7b0._1_1_ = auStack_760[1];
  uStack_7b0._2_1_ = auStack_760[2];
  uStack_7b0._3_1_ = auStack_760[3];
  uStack_7b0._4_1_ = auStack_760[4];
  uStack_7b0._5_1_ = auStack_760[5];
  uStack_7b0._6_1_ = auStack_760[6];
  bStack_7a9 = auStack_760[7];
  if ((char)(uVar3 & 0xf) == '\0') {
    sVar5 = 0x10;
  }
  n = (uint)sVar5;
  sVar5 = fwrite(buffer,1,sVar5,local_7c0);
  uVar8 = (ulong)n;
  uVar11 = uVar11 + 0x10;
  if (sVar5 != uVar8) goto code_r0x001038c2;
  goto LAB_0010380a;
code_r0x001038c2:
  pcVar10 = "fwrite(%d bytes) failed\n";
LAB_00103a66:
  fprintf(_stderr,pcVar10,uVar8);
  __stream = local_7e0;
  goto LAB_00103a93;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;

    unsigned int i, n;
    int mode, lastn;
    size_t keylen;
    FILE *fkey, *fin = NULL, *fout = NULL;

    char *p;

    unsigned char IV[16];
    unsigned char tmp[16];
    unsigned char key[512];
    unsigned char digest[32];
    unsigned char buffer[1024];
    unsigned char diff;

    mbedtls_aes_context aes_ctx;
    mbedtls_md_context_t sha_ctx;

#if defined(_WIN32_WCE)
    long filesize, offset;
#elif defined(_WIN32)
       LARGE_INTEGER li_size;
    __int64 filesize, offset;
#else
      off_t filesize, offset;
#endif

    mbedtls_aes_init( &aes_ctx );
    mbedtls_md_init( &sha_ctx );

    ret = mbedtls_md_setup( &sha_ctx, mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ), 1 );
    if( ret != 0 )
    {
        mbedtls_printf( "  ! mbedtls_md_setup() returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * Parse the command-line arguments.
     */
    if( argc != 5 )
    {
        mbedtls_printf( USAGE );

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        goto exit;
    }

    mode = atoi( argv[1] );
    memset( IV,     0, sizeof( IV ) );
    memset( key,    0, sizeof( key ) );
    memset( digest, 0, sizeof( digest ) );
    memset( buffer, 0, sizeof( buffer ) );

    if( mode != MODE_ENCRYPT && mode != MODE_DECRYPT )
    {
        mbedtls_fprintf( stderr, "invalide operation mode\n" );
        goto exit;
    }

    if( strcmp( argv[2], argv[3] ) == 0 )
    {
        mbedtls_fprintf( stderr, "input and output filenames must differ\n" );
        goto exit;
    }

    if( ( fin = fopen( argv[2], "rb" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,rb) failed\n", argv[2] );
        goto exit;
    }

    if( ( fout = fopen( argv[3], "wb+" ) ) == NULL )
    {
        mbedtls_fprintf( stderr, "fopen(%s,wb+) failed\n", argv[3] );
        goto exit;
    }

    /*
     * Read the secret key from file or command line
     */
    if( ( fkey = fopen( argv[4], "rb" ) ) != NULL )
    {
        keylen = fread( key, 1, sizeof( key ), fkey );
        fclose( fkey );
    }
    else
    {
        if( memcmp( argv[4], "hex:", 4 ) == 0 )
        {
            p = &argv[4][4];
            keylen = 0;

            while( sscanf( p, "%02X", &n ) > 0 &&
                   keylen < (int) sizeof( key ) )
            {
                key[keylen++] = (unsigned char) n;
                p += 2;
            }
        }
        else
        {
            keylen = strlen( argv[4] );

            if( keylen > (int) sizeof( key ) )
                keylen = (int) sizeof( key );

            memcpy( key, argv[4], keylen );
        }
    }

#if defined(_WIN32_WCE)
    filesize = fseek( fin, 0L, SEEK_END );
#else
#if defined(_WIN32)
    /*
     * Support large files (> 2Gb) on Win32
     */
    li_size.QuadPart = 0;
    li_size.LowPart  =
        SetFilePointer( (HANDLE) _get_osfhandle( _fileno( fin ) ),
                        li_size.LowPart, &li_size.HighPart, FILE_END );

    if( li_size.LowPart == 0xFFFFFFFF && GetLastError() != NO_ERROR )
    {
        mbedtls_fprintf( stderr, "SetFilePointer(0,FILE_END) failed\n" );
        goto exit;
    }

    filesize = li_size.QuadPart;
#else
    if( ( filesize = lseek( fileno( fin ), 0, SEEK_END ) ) < 0 )
    {
        perror( "lseek" );
        goto exit;
    }
#endif
#endif

    if( fseek( fin, 0, SEEK_SET ) < 0 )
    {
        mbedtls_fprintf( stderr, "fseek(0,SEEK_SET) failed\n" );
        goto exit;
    }

    if( mode == MODE_ENCRYPT )
    {
        /*
         * Generate the initialization vector as:
         * IV = SHA-256( filesize || filename )[0..15]
         */
        for( i = 0; i < 8; i++ )
            buffer[i] = (unsigned char)( filesize >> ( i << 3 ) );

        p = argv[2];

        mbedtls_md_starts( &sha_ctx );
        mbedtls_md_update( &sha_ctx, buffer, 8 );
        mbedtls_md_update( &sha_ctx, (unsigned char *) p, strlen( p ) );
        mbedtls_md_finish( &sha_ctx, digest );

        memcpy( IV, digest, 16 );

        /*
         * The last four bits in the IV are actually used
         * to store the file size modulo the AES block size.
         */
        lastn = (int)( filesize & 0x0F );

        IV[15] = (unsigned char)
            ( ( IV[15] & 0xF0 ) | lastn );

        /*
         * Append the IV at the beginning of the output.
         */
        if( fwrite( IV, 1, 16, fout ) != 16 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        mbedtls_aes_setkey_enc( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Encrypt and write the ciphertext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            n = ( filesize - offset > 16 ) ? 16 : (int)
                ( filesize - offset );

            if( fread( buffer, 1, n, fin ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", n );
                goto exit;
            }

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, buffer, buffer );
            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );

            if( fwrite( buffer, 1, 16, fout ) != 16 )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( IV, buffer, 16 );
        }

        /*
         * Finally write the HMAC.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fwrite( digest, 1, 32, fout ) != 32 )
        {
            mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", 16 );
            goto exit;
        }
    }

    if( mode == MODE_DECRYPT )
    {
        /*
         *  The encrypted file must be structured as follows:
         *
         *        00 .. 15              Initialization Vector
         *        16 .. 31              AES Encrypted Block #1
         *           ..
         *      N*16 .. (N+1)*16 - 1    AES Encrypted Block #N
         *  (N+1)*16 .. (N+1)*16 + 32   HMAC-SHA-256(ciphertext)
         */
        if( filesize < 48 )
        {
            mbedtls_fprintf( stderr, "File too short to be encrypted.\n" );
            goto exit;
        }

        if( ( filesize & 0x0F ) != 0 )
        {
            mbedtls_fprintf( stderr, "File size not a multiple of 16.\n" );
            goto exit;
        }

        /*
         * Subtract the IV + HMAC length.
         */
        filesize -= ( 16 + 32 );

        /*
         * Read the IV and original filesize modulo 16.
         */
        if( fread( buffer, 1, 16, fin ) != 16 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
            goto exit;
        }

        memcpy( IV, buffer, 16 );
        lastn = IV[15] & 0x0F;

        /*
         * Hash the IV and the secret key together 8192 times
         * using the result to setup the AES context and HMAC.
         */
        memset( digest, 0,  32 );
        memcpy( digest, IV, 16 );

        for( i = 0; i < 8192; i++ )
        {
            mbedtls_md_starts( &sha_ctx );
            mbedtls_md_update( &sha_ctx, digest, 32 );
            mbedtls_md_update( &sha_ctx, key, keylen );
            mbedtls_md_finish( &sha_ctx, digest );
        }

        mbedtls_aes_setkey_dec( &aes_ctx, digest, 256 );
        mbedtls_md_hmac_starts( &sha_ctx, digest, 32 );

        /*
         * Decrypt and write the plaintext.
         */
        for( offset = 0; offset < filesize; offset += 16 )
        {
            if( fread( buffer, 1, 16, fin ) != 16 )
            {
                mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 16 );
                goto exit;
            }

            memcpy( tmp, buffer, 16 );

            mbedtls_md_hmac_update( &sha_ctx, buffer, 16 );
            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_DECRYPT, buffer, buffer );

            for( i = 0; i < 16; i++ )
                buffer[i] = (unsigned char)( buffer[i] ^ IV[i] );

            memcpy( IV, tmp, 16 );

            n = ( lastn > 0 && offset == filesize - 16 )
                ? lastn : 16;

            if( fwrite( buffer, 1, n, fout ) != (size_t) n )
            {
                mbedtls_fprintf( stderr, "fwrite(%d bytes) failed\n", n );
                goto exit;
            }
        }

        /*
         * Verify the message authentication code.
         */
        mbedtls_md_hmac_finish( &sha_ctx, digest );

        if( fread( buffer, 1, 32, fin ) != 32 )
        {
            mbedtls_fprintf( stderr, "fread(%d bytes) failed\n", 32 );
            goto exit;
        }

        /* Use constant-time buffer comparison */
        diff = 0;
        for( i = 0; i < 32; i++ )
            diff |= digest[i] ^ buffer[i];

        if( diff != 0 )
        {
            mbedtls_fprintf( stderr, "HMAC check failed: wrong key, "
                             "or file corrupted.\n" );
            goto exit;
        }
    }

    ret = 0;

exit:
    if( fin )
        fclose( fin );
    if( fout )
        fclose( fout );

    /* Zeroize all command line arguments to also cover
       the case when the user has missed or reordered some,
       in which case the key might not be in argv[4]. */
    for( i = 0; i < (unsigned int) argc; i++ )
        memset( argv[i], 0, strlen( argv[i] ) );

    memset( IV,     0, sizeof( IV ) );
    memset( key,    0, sizeof( key ) );
    memset( tmp,    0, sizeof( tmp ) );
    memset( buffer, 0, sizeof( buffer ) );
    memset( digest, 0, sizeof( digest ) );

    mbedtls_aes_free( &aes_ctx );
    mbedtls_md_free( &sha_ctx );

    return( ret );
}